

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall
TaprootScriptTree_Branch2_Test::~TaprootScriptTree_Branch2_Test
          (TaprootScriptTree_Branch2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch2) {
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(leaf_version, script);
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  bool parity = false;
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("dc650bb6e95f7ee50dfbddf68651f77cd78c68f8f6c0c64014e5ef7c829c3635",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("300af27b4b5d270ec1ccc147210af5904724ef72d3ead21c569564a1536d33a3",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("7801a8819654c6c31f5a7cbd152f881a138e2adfc64da9dc1f78fbf80640f53a",
      tree.GetTweakedPrivkey(key, &parity).GetHex());
  EXPECT_TRUE(parity);

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));
}